

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coordinatemenu.cpp
# Opt level: O2

void __thiscall gamespace::CoordinateMenu::invalidate(CoordinateMenu *this)

{
  pointer ppRVar1;
  Renderable *this_00;
  pointer ppRVar2;
  
  ui::Renderable::delete_payload(&this->_coordinates->super_Renderable);
  ui::Renderable::delete_payload(&this->_unit_text->super_Renderable);
  ui::Renderable::delete_payload(&this->_hp_text->super_Renderable);
  ui::Renderable::delete_payload(&this->_qt->super_Renderable);
  ui::Renderable::delete_payload(&this->_unit_hp->super_Renderable);
  rebuild_payload(&this->_hp_text->super_Renderable);
  rebuild_payload(&this->_coordinates->super_Renderable);
  rebuild_payload(&this->_unit_text->super_Renderable);
  rebuild_payload(&this->_unit_hp->super_Renderable);
  rebuild_payload(&this->_qt->super_Renderable);
  ppRVar1 = (this->_action_items).
            super__Vector_base<ui::Renderable_*,_std::allocator<ui::Renderable_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppRVar2 = (this->_action_items).
                 super__Vector_base<ui::Renderable_*,_std::allocator<ui::Renderable_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppRVar2 != ppRVar1; ppRVar2 = ppRVar2 + 1) {
    this_00 = *ppRVar2;
    ui::Renderable::delete_payload(this_00);
    rebuild_payload(this_00);
  }
  return;
}

Assistant:

void CoordinateMenu::invalidate() {
    _coordinates->delete_payload();
    _unit_text->delete_payload();
    _hp_text->delete_payload();
    _qt->delete_payload();
    _unit_hp->delete_payload();
    rebuild_payload(_hp_text);
    rebuild_payload(_coordinates);
    rebuild_payload(_unit_text);
    rebuild_payload(_unit_hp);
    rebuild_payload(_qt);
    for(auto *r : _action_items) {
        r->delete_payload();
        rebuild_payload(r);
    }
}